

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STExchange.h
# Opt level: O2

void jbcoin::set<jbcoin::STBlob,jbcoin::Buffer>
               (STObject *st,TypedField<jbcoin::STBlob> *f,Buffer *t)

{
  STBase *pSVar1;
  pointer *__ptr;
  STBase *local_28;
  _Head_base<0UL,_jbcoin::STBase_*,_false> local_20;
  
  std::make_unique<jbcoin::STBlob,jbcoin::TypedField<jbcoin::STBlob>const&,jbcoin::Buffer>
            ((TypedField<jbcoin::STBlob> *)&local_28,(Buffer *)f);
  pSVar1 = local_28;
  local_28 = (STBase *)0x0;
  local_20._M_head_impl = pSVar1;
  STObject::set(st,(unique_ptr<jbcoin::STBase,_std::default_delete<jbcoin::STBase>_> *)&local_20);
  if (pSVar1 != (STBase *)0x0) {
    (*pSVar1->_vptr_STBase[1])(pSVar1);
  }
  if (local_28 != (STBase *)0x0) {
    (**(code **)(*(long *)local_28 + 8))();
  }
  return;
}

Assistant:

void
set (STObject& st,
    TypedField<U> const& f, T&& t)
{
    st.set(STExchange<U,
        typename std::decay<T>::type>::set(
            f, std::forward<T>(t)));
}